

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::remove_handler(Fl_Event_Handler ha)

{
  handler_link *phVar1;
  handler_link *phVar2;
  handler_link **pphVar3;
  
  pphVar3 = &handlers;
  phVar2 = (handler_link *)0x0;
  while( true ) {
    phVar1 = *pphVar3;
    if (phVar1 == (handler_link *)0x0) {
      return;
    }
    if (phVar1->handle == ha) break;
    pphVar3 = &phVar1->next;
    phVar2 = phVar1;
  }
  pphVar3 = &handlers;
  if (phVar2 != (handler_link *)0x0) {
    pphVar3 = &phVar2->next;
  }
  *pphVar3 = phVar1->next;
  operator_delete(phVar1,0x10);
  return;
}

Assistant:

void Fl::remove_handler(Fl_Event_Handler ha) {
  handler_link *l, *p;

  // Search for the handler in the list...
  for (l = handlers, p = 0; l && l->handle != ha; p = l, l = l->next) {/*empty*/}

  if (l) {
    // Found it, so remove it from the list...
    if (p) p->next = l->next;
    else handlers = l->next;

    // And free the record...
    delete l;
  }
}